

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_resources(Compiler *compiler,char *tag,SmallVector<spirv_cross::Resource,_8UL> *resources
                    )

{
  uint *puVar1;
  size_type sVar2;
  FILE *pFVar3;
  bool bVar4;
  int iVar5;
  StorageClass SVar6;
  StorageClass SVar7;
  uint uVar8;
  uint32_t uVar9;
  SPIRType *pSVar10;
  Bitset *pBVar11;
  SPIRType *type;
  size_t sVar12;
  size_t sVar13;
  string *psVar14;
  undefined4 uVar15;
  undefined8 extraout_RDX;
  _Alloc_hider in_R8;
  Resource *pRVar16;
  long lVar17;
  Resource *pRVar18;
  uint32_t local_174;
  allocator local_161;
  ulong local_160;
  size_t local_158;
  undefined4 local_14c;
  CompilerGLSL *local_148;
  Resource *local_140;
  Bitset mask;
  string array;
  string local_b0;
  uint32_t counter_id;
  string local_70 [32];
  string local_50;
  
  fprintf(_stderr,"%s\n",tag);
  fwrite("=============\n\n",0xf,1,_stderr);
  iVar5 = strcmp(tag,"ssbos");
  pRVar16 = (resources->super_VectorView<spirv_cross::Resource>).ptr;
  pRVar18 = pRVar16 + (resources->super_VectorView<spirv_cross::Resource>).buffer_size;
  local_148 = (CompilerGLSL *)compiler;
  local_140 = pRVar18;
  do {
    if (pRVar16 == pRVar18) {
      fwrite("=============\n\n",0xf,1,_stderr);
      return;
    }
    pSVar10 = spirv_cross::Compiler::get_type(compiler,(TypeID)(pRVar16->type_id).id);
    if ((iVar5 != 0) ||
       (bVar4 = spirv_cross::Compiler::buffer_is_hlsl_counter_buffer
                          (compiler,(VariableID)(pRVar16->id).id), !bVar4)) {
      SVar6 = spirv_cross::Compiler::get_storage_class(compiler,(VariableID)(pRVar16->id).id);
      pBVar11 = spirv_cross::Compiler::get_decoration_bitset
                          (compiler,(ID)(pSVar10->super_IVariant).self.id);
      if (((pBVar11->lower & 4) == 0) &&
         (pBVar11 = spirv_cross::Compiler::get_decoration_bitset
                              (compiler,(ID)(pSVar10->super_IVariant).self.id),
         (pBVar11->lower & 8) == 0)) {
        local_174 = (pRVar16->id).id;
        uVar15 = 0;
        local_160 = 0;
        local_158 = 0;
      }
      else {
        SVar7 = spirv_cross::Compiler::get_storage_class(compiler,(VariableID)(pRVar16->id).id);
        if (SVar7 == StorageClassUniform) {
          if (SVar6 == StorageClassPushConstant) {
            local_174 = (pRVar16->id).id;
          }
          else {
            local_174 = (pRVar16->base_type_id).id;
          }
        }
        else {
          SVar7 = spirv_cross::Compiler::get_storage_class(compiler,(VariableID)(pRVar16->id).id);
          uVar15 = 0;
          if (SVar6 == StorageClassPushConstant) {
            local_174 = (pRVar16->id).id;
          }
          else {
            local_174 = (pRVar16->base_type_id).id;
          }
          local_160 = 0;
          local_158 = 0;
          if (SVar7 != StorageClassUniformConstant) goto LAB_0011277e;
        }
        type = spirv_cross::Compiler::get_type(compiler,(TypeID)(pRVar16->base_type_id).id);
        local_158 = spirv_cross::Compiler::get_declared_struct_size(compiler,type);
        sVar12 = spirv_cross::Compiler::get_declared_struct_size_runtime_array(compiler,type,1);
        sVar13 = spirv_cross::Compiler::get_declared_struct_size_runtime_array(compiler,type,0);
        local_160 = (ulong)(uint)((int)sVar12 - (int)sVar13);
        uVar15 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      }
LAB_0011277e:
      mask.lower = 0;
      mask.higher._M_h._M_buckets = &mask.higher._M_h._M_single_bucket;
      mask.higher._M_h._M_bucket_count = 1;
      mask.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      mask.higher._M_h._M_element_count = 0;
      mask.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      mask.higher._M_h._M_rehash_policy._M_next_resize = 0;
      mask.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_14c = uVar15;
      if (iVar5 == 0) {
        spirv_cross::Compiler::get_buffer_block_flags
                  ((Bitset *)&array,compiler,(VariableID)(pRVar16->id).id);
        spirv_cross::Bitset::operator=(&mask,(Bitset *)&array);
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&array._M_string_length);
      }
      else {
        pBVar11 = spirv_cross::Compiler::get_decoration_bitset(compiler,(ID)(pRVar16->id).id);
        spirv_cross::Bitset::operator=(&mask,pBVar11);
      }
      array._M_dataplus._M_p = (pointer)&array.field_2;
      array._M_string_length = 0;
      array.field_2._M_local_buf[0] = '\0';
      puVar1 = (pSVar10->array).super_VectorView<unsigned_int>.ptr;
      sVar12 = (pSVar10->array).super_VectorView<unsigned_int>.buffer_size;
      for (lVar17 = 0; compiler = &local_148->super_Compiler, pFVar3 = _stderr,
          sVar12 << 2 != lVar17; lVar17 = lVar17 + 4) {
        uVar8 = *(uint *)((long)puVar1 + lVar17);
        if (uVar8 == 0) {
          std::__cxx11::string::string((string *)&local_b0,"",&local_161);
        }
        else {
          std::__cxx11::to_string(&local_b0,uVar8);
        }
        spirv_cross::join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_50,(spirv_cross *)0x2828da,(char (*) [2])&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2827df,
                   (char (*) [2])in_R8._M_p);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &counter_id,&local_50,&array);
        std::__cxx11::string::operator=((string *)&array,(string *)&counter_id);
        std::__cxx11::string::~string((string *)&counter_id);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      uVar8 = (pRVar16->id).id;
      sVar2 = (pRVar16->name)._M_string_length;
      if (sVar2 == 0) {
        psVar14 = local_70;
        (*(local_148->super_Compiler)._vptr_Compiler[3])(psVar14,local_148,(ulong)local_174);
      }
      else {
        psVar14 = (string *)&pRVar16->name;
      }
      in_R8._M_p = array._M_dataplus._M_p;
      fprintf(pFVar3," ID %03u : %s%s",(ulong)uVar8,*(undefined8 *)psVar14);
      if (sVar2 == 0) {
        std::__cxx11::string::~string(local_70);
      }
      pFVar3 = _stderr;
      if (((uint)mask.lower >> 0x1e & 1) != 0) {
        uVar9 = spirv_cross::Compiler::get_decoration
                          (compiler,(ID)(pRVar16->id).id,DecorationLocation);
        fprintf(pFVar3," (Location : %u)",(ulong)uVar9);
      }
      pFVar3 = _stderr;
      if ((mask.lower >> 0x22 & 1) != 0) {
        uVar9 = spirv_cross::Compiler::get_decoration
                          (compiler,(ID)(pRVar16->id).id,DecorationDescriptorSet);
        fprintf(pFVar3," (Set : %u)",(ulong)uVar9);
      }
      pFVar3 = _stderr;
      if ((mask.lower >> 0x21 & 1) != 0) {
        uVar9 = spirv_cross::Compiler::get_decoration
                          (compiler,(ID)(pRVar16->id).id,DecorationBinding);
        fprintf(pFVar3," (Binding : %u)",(ulong)uVar9);
      }
      bVar4 = spirv_cross::CompilerGLSL::variable_is_depth_or_compare
                        ((CompilerGLSL *)compiler,(VariableID)(pRVar16->id).id);
      if (bVar4) {
        fwrite(" (comparison)",0xd,1,_stderr);
      }
      pFVar3 = _stderr;
      if ((mask.lower >> 0x2b & 1) != 0) {
        uVar9 = spirv_cross::Compiler::get_decoration
                          (compiler,(ID)(pRVar16->id).id,DecorationInputAttachmentIndex);
        fprintf(pFVar3," (Attachment : %u)",(ulong)uVar9);
      }
      pRVar18 = local_140;
      uVar8 = (uint)mask.lower;
      if ((uVar8 >> 0x19 & 1) != 0) {
        fwrite(" writeonly",10,1,_stderr);
        uVar8 = (uint)mask.lower;
      }
      if ((uVar8 >> 0x18 & 1) != 0) {
        fwrite(" readonly",9,1,_stderr);
        uVar8 = (uint)mask.lower;
      }
      if ((uVar8 >> 0x13 & 1) != 0) {
        fwrite(" restrict",9,1,_stderr);
        uVar8 = (uint)mask.lower;
      }
      if ((uVar8 >> 0x17 & 1) != 0) {
        fwrite(" coherent",9,1,_stderr);
        uVar8 = (uint)mask.lower;
      }
      if ((uVar8 >> 0x15 & 1) != 0) {
        fwrite(" volatile",9,1,_stderr);
      }
      if ((char)local_14c != '\0') {
        fprintf(_stderr," (BlockSize : %u bytes)",local_158);
        if ((int)local_160 != 0) {
          fprintf(_stderr," (Unsized array stride: %u bytes)",local_160);
        }
      }
      counter_id = 0;
      if ((iVar5 == 0) &&
         (bVar4 = spirv_cross::Compiler::buffer_get_hlsl_counter_buffer
                            (compiler,(VariableID)(pRVar16->id).id,&counter_id), bVar4)) {
        fprintf(_stderr," (HLSL counter buffer ID: %u)",(ulong)counter_id);
      }
      fputc(10,_stderr);
      std::__cxx11::string::~string((string *)&array);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&mask.higher._M_h);
    }
    pRVar16 = pRVar16 + 1;
  } while( true );
}

Assistant:

static void print_resources(const Compiler &compiler, const char *tag, const SmallVector<Resource> &resources)
{
	fprintf(stderr, "%s\n", tag);
	fprintf(stderr, "=============\n\n");
	bool print_ssbo = !strcmp(tag, "ssbos");

	for (auto &res : resources)
	{
		auto &type = compiler.get_type(res.type_id);

		if (print_ssbo && compiler.buffer_is_hlsl_counter_buffer(res.id))
			continue;

		// If we don't have a name, use the fallback for the type instead of the variable
		// for SSBOs and UBOs since those are the only meaningful names to use externally.
		// Push constant blocks are still accessed by name and not block name, even though they are technically Blocks.
		bool is_push_constant = compiler.get_storage_class(res.id) == StorageClassPushConstant;
		bool is_block = compiler.get_decoration_bitset(type.self).get(DecorationBlock) ||
		                compiler.get_decoration_bitset(type.self).get(DecorationBufferBlock);
		bool is_sized_block = is_block && (compiler.get_storage_class(res.id) == StorageClassUniform ||
		                                   compiler.get_storage_class(res.id) == StorageClassUniformConstant);
		ID fallback_id = !is_push_constant && is_block ? ID(res.base_type_id) : ID(res.id);

		uint32_t block_size = 0;
		uint32_t runtime_array_stride = 0;
		if (is_sized_block)
		{
			auto &base_type = compiler.get_type(res.base_type_id);
			block_size = uint32_t(compiler.get_declared_struct_size(base_type));
			runtime_array_stride = uint32_t(compiler.get_declared_struct_size_runtime_array(base_type, 1) -
			                                compiler.get_declared_struct_size_runtime_array(base_type, 0));
		}

		Bitset mask;
		if (print_ssbo)
			mask = compiler.get_buffer_block_flags(res.id);
		else
			mask = compiler.get_decoration_bitset(res.id);

		string array;
		for (auto arr : type.array)
			array = join("[", arr ? convert_to_string(arr) : "", "]") + array;

		fprintf(stderr, " ID %03u : %s%s", uint32_t(res.id),
		        !res.name.empty() ? res.name.c_str() : compiler.get_fallback_name(fallback_id).c_str(), array.c_str());

		if (mask.get(DecorationLocation))
			fprintf(stderr, " (Location : %u)", compiler.get_decoration(res.id, DecorationLocation));
		if (mask.get(DecorationDescriptorSet))
			fprintf(stderr, " (Set : %u)", compiler.get_decoration(res.id, DecorationDescriptorSet));
		if (mask.get(DecorationBinding))
			fprintf(stderr, " (Binding : %u)", compiler.get_decoration(res.id, DecorationBinding));
		if (static_cast<const CompilerGLSL &>(compiler).variable_is_depth_or_compare(res.id))
			fprintf(stderr, " (comparison)");
		if (mask.get(DecorationInputAttachmentIndex))
			fprintf(stderr, " (Attachment : %u)", compiler.get_decoration(res.id, DecorationInputAttachmentIndex));
		if (mask.get(DecorationNonReadable))
			fprintf(stderr, " writeonly");
		if (mask.get(DecorationNonWritable))
			fprintf(stderr, " readonly");
		if (mask.get(DecorationRestrict))
			fprintf(stderr, " restrict");
		if (mask.get(DecorationCoherent))
			fprintf(stderr, " coherent");
		if (mask.get(DecorationVolatile))
			fprintf(stderr, " volatile");
		if (is_sized_block)
		{
			fprintf(stderr, " (BlockSize : %u bytes)", block_size);
			if (runtime_array_stride)
				fprintf(stderr, " (Unsized array stride: %u bytes)", runtime_array_stride);
		}

		uint32_t counter_id = 0;
		if (print_ssbo && compiler.buffer_get_hlsl_counter_buffer(res.id, counter_id))
			fprintf(stderr, " (HLSL counter buffer ID: %u)", counter_id);
		fprintf(stderr, "\n");
	}
	fprintf(stderr, "=============\n\n");
}